

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_rewrite_module.c
# Opt level: O3

char * ngx_http_rewrite_if(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  char cVar1;
  u_char uVar2;
  byte bVar3;
  size_t *psVar4;
  ngx_http_core_loc_conf_t *clcf;
  void *pvVar5;
  ngx_uint_t nVar6;
  ulong uVar7;
  ngx_array_t *pnVar8;
  size_t sVar9;
  undefined8 uVar10;
  ngx_http_rewrite_loc_conf_t *pnVar11;
  undefined8 *puVar12;
  void **ppvVar13;
  long lVar14;
  ngx_int_t nVar15;
  char *pcVar16;
  char *pcVar17;
  undefined8 *puVar18;
  ngx_http_regex_t *pnVar19;
  ngx_cycle_t *pnVar20;
  char *pcVar21;
  code *pcVar22;
  ngx_module_t *pnVar23;
  ulong uVar24;
  ngx_conf_t *pnVar25;
  u_char *puVar26;
  ngx_str_t *value;
  undefined8 *puVar27;
  long lVar28;
  bool bVar29;
  byte bVar30;
  u_char local_498 [8];
  ngx_conf_t save;
  ngx_regex_compile_t local_98;
  ngx_http_rewrite_loc_conf_t *local_48;
  u_char *local_40;
  long *local_38;
  
  bVar30 = 0;
  puVar12 = (undefined8 *)ngx_pcalloc(cf->pool,0x18);
  if (puVar12 == (undefined8 *)0x0) {
    return (char *)0xffffffffffffffff;
  }
  puVar18 = (undefined8 *)cf->ctx;
  *puVar12 = *puVar18;
  puVar12[1] = puVar18[1];
  ppvVar13 = (void **)ngx_pcalloc(cf->pool,ngx_http_max_module << 3);
  puVar12[2] = ppvVar13;
  if (ppvVar13 == (void **)0x0) {
    return (char *)0xffffffffffffffff;
  }
  pnVar20 = cf->cycle;
  pnVar23 = *pnVar20->modules;
  if (pnVar23 != (ngx_module_t *)0x0) {
    lVar28 = 0;
    do {
      if ((pnVar23->type == 0x50545448) &&
         (pcVar22 = *(code **)((long)pnVar23->ctx + 0x30), pcVar22 != (code *)0x0)) {
        lVar14 = (*pcVar22)(cf);
        if (lVar14 == 0) {
          return (char *)0xffffffffffffffff;
        }
        *(long *)(puVar12[2] + **(long **)((long)cf->cycle->modules + lVar28) * 8) = lVar14;
        pnVar20 = cf->cycle;
      }
      pnVar23 = *(ngx_module_t **)((long)pnVar20->modules + lVar28 + 8);
      lVar28 = lVar28 + 8;
    } while (pnVar23 != (ngx_module_t *)0x0);
    ppvVar13 = (void **)puVar12[2];
  }
  psVar4 = *(size_t **)(puVar18[2] + ngx_http_core_module.ctx_index * 8);
  clcf = (ngx_http_core_loc_conf_t *)ppvVar13[ngx_http_core_module.ctx_index];
  clcf->loc_conf = ppvVar13;
  puVar26 = (u_char *)psVar4[1];
  (clcf->name).len = *psVar4;
  (clcf->name).data = puVar26;
  clcf->field_0x18 = clcf->field_0x18 | 1;
  nVar15 = ngx_http_add_location(cf,(ngx_queue_t **)(psVar4 + 0x53),clcf);
  if (nVar15 != 0) {
    return (char *)0xffffffffffffffff;
  }
  pvVar5 = cf->args->elts;
  lVar28 = *(long *)((long)pvVar5 + 0x10);
  if ((lVar28 == 0) || (**(char **)((long)pvVar5 + 0x18) != '(')) {
    value = (ngx_str_t *)((long)pvVar5 + 0x10);
    pcVar21 = "invalid condition \"%V\"";
    goto LAB_0016d306;
  }
  nVar6 = cf->args->nelts;
  pcVar21 = (char *)(nVar6 - 1);
  pcVar16 = (char *)0x2;
  if (lVar28 != 1) {
    *(long *)((long)pvVar5 + 0x10) = lVar28 + -1;
    *(char **)((long)pvVar5 + 0x18) = *(char **)((long)pvVar5 + 0x18) + 1;
    pcVar16 = &DAT_00000001;
  }
  value = (ngx_str_t *)((long)pcVar21 * 0x10 + (long)pvVar5);
  lVar28 = *(long *)((long)pvVar5 + (long)pcVar21 * 0x10);
  if ((lVar28 == 0) || (value->data[lVar28 + -1] != ')')) {
    pcVar21 = "invalid condition \"%V\"";
    goto LAB_0016d306;
  }
  if (lVar28 == 1) {
    pcVar21 = (char *)(nVar6 - 2);
  }
  else {
    value->len = lVar28 - 1;
    value->data[lVar28 + -1] = '\0';
  }
  uVar24 = (ulong)(uint)((int)pcVar16 << 4);
  value = (ngx_str_t *)(uVar24 + (long)pvVar5);
  uVar7 = *(ulong *)((long)pvVar5 + uVar24);
  pcVar17 = *(char **)((long)pvVar5 + uVar24 + 8);
  if ((uVar7 < 2) || (*pcVar17 != '$')) {
    if (uVar7 == 3) {
      if (*pcVar17 == '!') {
        cVar1 = pcVar17[1];
        goto joined_r0x0016cfe5;
      }
    }
    else if (uVar7 == 2) {
      cVar1 = *pcVar17;
joined_r0x0016cfe5:
      if ((cVar1 == '-') && (pcVar16 + 1 == pcVar21)) {
        lVar28 = (long)pcVar21 * 0x10;
        *(undefined1 *)(*(long *)((long)pvVar5 + lVar28 + 8) + *(long *)((long)pvVar5 + lVar28)) = 0
        ;
        *(long *)((long)pvVar5 + lVar28) = *(long *)((long)pvVar5 + lVar28) + 1;
        local_38 = (long *)pcVar17;
        pcVar21 = ngx_http_rewrite_value
                            (cf,(ngx_http_rewrite_loc_conf_t *)conf,
                             (ngx_str_t *)(lVar28 + (long)pvVar5));
        if (pcVar21 != (char *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        puVar18 = (undefined8 *)ngx_http_script_start_code(cf->pool,(ngx_array_t **)conf,0x10);
        if (puVar18 == (undefined8 *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        *puVar18 = ngx_http_script_file_code;
        bVar3 = *(byte *)((long)local_38 + 1);
        if (bVar3 < 0x66) {
          if (bVar3 == 100) {
            puVar18[1] = 2;
            local_48 = (ngx_http_rewrite_loc_conf_t *)conf;
            goto LAB_0016ceda;
          }
          if (bVar3 == 0x65) {
            puVar18[1] = 4;
            local_48 = (ngx_http_rewrite_loc_conf_t *)conf;
            goto LAB_0016ceda;
          }
        }
        else {
          if (bVar3 == 0x78) {
            puVar18[1] = 6;
            local_48 = (ngx_http_rewrite_loc_conf_t *)conf;
            goto LAB_0016ceda;
          }
          if (bVar3 == 0x66) {
            puVar18[1] = 0;
            local_48 = (ngx_http_rewrite_loc_conf_t *)conf;
            goto LAB_0016ceda;
          }
        }
        local_48 = (ngx_http_rewrite_loc_conf_t *)conf;
        if ((char)*local_38 == '!') {
          bVar3 = *(byte *)((long)local_38 + 2);
          if (bVar3 < 0x66) {
            if (bVar3 == 100) {
              puVar18[1] = 3;
LAB_0016ceda:
              pnVar11 = local_48;
              puVar18 = (undefined8 *)ngx_array_push_n(local_48->codes,0x18);
              if (puVar18 == (undefined8 *)0x0) {
                return (char *)0xffffffffffffffff;
              }
              *puVar18 = ngx_http_script_if_code;
              pnVar8 = pnVar11->codes;
              local_40 = (u_char *)pnVar8->elts;
              lVar28 = puVar12[2];
              local_38 = *(long **)(lVar28 + ngx_http_rewrite_module.ctx_index * 8);
              *local_38 = (long)pnVar8;
              pnVar25 = cf;
              puVar26 = local_498;
              for (lVar14 = 0xc; lVar14 != 0; lVar14 = lVar14 + -1) {
                *(char **)puVar26 = pnVar25->name;
                pnVar25 = (ngx_conf_t *)((long)pnVar25 + (ulong)bVar30 * -0x10 + 8);
                puVar26 = puVar26 + ((ulong)bVar30 * -2 + 1) * 8;
              }
              cf->ctx = puVar12;
              bVar29 = cf->cmd_type != 0x4000000;
              if (!bVar29) {
                lVar28 = 0;
              }
              puVar18[2] = lVar28;
              cf->cmd_type = (ulong)((uint)bVar29 << 0x1d) + 0x20000000;
              pcVar21 = ngx_conf_parse(cf,(ngx_str_t *)0x0);
              puVar26 = local_498;
              for (lVar28 = 0xc; lVar28 != 0; lVar28 = lVar28 + -1) {
                cf->name = *(char **)puVar26;
                puVar26 = puVar26 + ((ulong)bVar30 * -2 + 1) * 8;
                cf = (ngx_conf_t *)((long)cf + (ulong)bVar30 * -0x10 + 8);
              }
              if (pcVar21 == (char *)0x0) {
                pnVar8 = pnVar11->codes;
                pvVar5 = pnVar8->elts;
                lVar28 = (long)pvVar5 - (long)local_40;
                if (lVar28 == 0) {
                  lVar28 = 0;
                }
                *(ngx_uint_t *)((long)(puVar18 + 1) + lVar28) =
                     (long)pvVar5 + (pnVar8->nelts - ((long)puVar18 + lVar28));
                *local_38 = 0;
                return (char *)0x0;
              }
              return pcVar21;
            }
            if (bVar3 == 0x65) {
              puVar18[1] = 5;
              goto LAB_0016ceda;
            }
          }
          else {
            if (bVar3 == 0x78) {
              puVar18[1] = 7;
              goto LAB_0016ceda;
            }
            if (bVar3 == 0x66) {
              puVar18[1] = 1;
              goto LAB_0016ceda;
            }
          }
        }
      }
    }
  }
  else if (pcVar16 + 2 == pcVar21 || pcVar16 == pcVar21) {
    local_48 = (ngx_http_rewrite_loc_conf_t *)conf;
    local_38 = (long *)pcVar21;
    pcVar17 = ngx_http_rewrite_variable(cf,(ngx_http_rewrite_loc_conf_t *)conf,value);
    pnVar11 = local_48;
    if (pcVar17 != (char *)0x0 || pcVar16 == pcVar21) {
      if (pcVar17 != (char *)0x0) {
        return (char *)0xffffffffffffffff;
      }
      goto LAB_0016ceda;
    }
    sVar9 = value[1].len;
    puVar26 = value[1].data;
    if (sVar9 == 3) {
      if ((*puVar26 == '!') && (puVar26[1] == '~')) {
        uVar2 = puVar26[2];
joined_r0x0016d183:
        if (uVar2 == '*') {
LAB_0016d1ba:
          local_40 = puVar26;
          puVar18 = (undefined8 *)ngx_http_script_start_code(cf->pool,&local_48->codes,0x48);
          if (puVar18 == (undefined8 *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          puVar18[6] = 0;
          puVar18[7] = 0;
          puVar18[4] = 0;
          puVar18[5] = 0;
          puVar18[2] = 0;
          puVar18[3] = 0;
          *puVar18 = 0;
          puVar18[1] = 0;
          puVar18[8] = 0;
          local_98.name_size = 0;
          local_98._52_4_ = 0;
          local_98.names = (u_char *)0x0;
          local_98.regex = (ngx_regex_t *)0x0;
          local_98.captures = 0;
          local_98.named_captures = 0;
          local_98.pool = (ngx_pool_t *)0x0;
          lVar28 = (long)local_38 * 0x10;
          psVar4 = (size_t *)((long)pvVar5 + lVar28);
          local_98.pattern.len = *psVar4;
          local_98.pattern.data = (u_char *)psVar4[1];
          local_98.options = (ngx_int_t)(local_40[sVar9 - 1] == '*');
          local_98.err.len = 0x400;
          local_98.err.data = local_498;
          pnVar19 = ngx_http_regex_compile(cf,&local_98);
          puVar18[1] = pnVar19;
          if (pnVar19 == (ngx_http_regex_t *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          puVar27 = (undefined8 *)((long)pvVar5 + lVar28);
          *puVar18 = ngx_http_script_regex_start_code;
          puVar18[5] = 0x48;
          bVar3 = *(byte *)(puVar18 + 6);
          *(byte *)(puVar18 + 6) = bVar3 | 1;
          if (*local_40 == '!') {
            *(byte *)(puVar18 + 6) = bVar3 | 3;
          }
          uVar10 = puVar27[1];
          puVar18[7] = *puVar27;
          puVar18[8] = uVar10;
          goto LAB_0016ceda;
        }
      }
    }
    else if (sVar9 == 2) {
      if (*puVar26 == '~') {
        uVar2 = puVar26[1];
        goto joined_r0x0016d183;
      }
      if (*puVar26 == '!') {
        if (puVar26[1] == '~') goto LAB_0016d1ba;
        if (puVar26[1] == '=') {
          pcVar21 = ngx_http_rewrite_value
                              (cf,local_48,(ngx_str_t *)((long)pvVar5 + (long)local_38 * 0x10));
          if (pcVar21 != (char *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          puVar18 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar11->codes,8);
          if (puVar18 == (undefined8 *)0x0) {
            return (char *)0xffffffffffffffff;
          }
          pcVar22 = ngx_http_script_not_equal_code;
          goto LAB_0016d168;
        }
      }
    }
    else if (sVar9 == 1) {
      if (*puVar26 == '~') goto LAB_0016d1ba;
      if (*puVar26 == '=') {
        pcVar21 = ngx_http_rewrite_value
                            (cf,local_48,(ngx_str_t *)((long)pvVar5 + (long)local_38 * 0x10));
        if (pcVar21 != (char *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        puVar18 = (undefined8 *)ngx_http_script_start_code(cf->pool,&pnVar11->codes,8);
        if (puVar18 == (undefined8 *)0x0) {
          return (char *)0xffffffffffffffff;
        }
        pcVar22 = ngx_http_script_equal_code;
LAB_0016d168:
        *puVar18 = pcVar22;
        goto LAB_0016ceda;
      }
    }
    value = value + 1;
    pcVar21 = "unexpected \"%V\" in condition";
    goto LAB_0016d306;
  }
  pcVar21 = "invalid condition \"%V\"";
LAB_0016d306:
  ngx_conf_log_error(1,cf,0,pcVar21,value);
  return (char *)0xffffffffffffffff;
}

Assistant:

static char *
ngx_http_rewrite_if(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_http_rewrite_loc_conf_t  *lcf = conf;

    void                         *mconf;
    char                         *rv;
    u_char                       *elts;
    ngx_uint_t                    i;
    ngx_conf_t                    save;
    ngx_http_module_t            *module;
    ngx_http_conf_ctx_t          *ctx, *pctx;
    ngx_http_core_loc_conf_t     *clcf, *pclcf;
    ngx_http_script_if_code_t    *if_code;
    ngx_http_rewrite_loc_conf_t  *nlcf;

    ctx = ngx_pcalloc(cf->pool, sizeof(ngx_http_conf_ctx_t));
    if (ctx == NULL) {
        return NGX_CONF_ERROR;
    }

    pctx = cf->ctx;
    ctx->main_conf = pctx->main_conf;
    ctx->srv_conf = pctx->srv_conf;

    ctx->loc_conf = ngx_pcalloc(cf->pool, sizeof(void *) * ngx_http_max_module);
    if (ctx->loc_conf == NULL) {
        return NGX_CONF_ERROR;
    }

    for (i = 0; cf->cycle->modules[i]; i++) {
        if (cf->cycle->modules[i]->type != NGX_HTTP_MODULE) {
            continue;
        }

        module = cf->cycle->modules[i]->ctx;

        if (module->create_loc_conf) {

            mconf = module->create_loc_conf(cf);
            if (mconf == NULL) {
                return NGX_CONF_ERROR;
            }

            ctx->loc_conf[cf->cycle->modules[i]->ctx_index] = mconf;
        }
    }

    pclcf = pctx->loc_conf[ngx_http_core_module.ctx_index];

    clcf = ctx->loc_conf[ngx_http_core_module.ctx_index];
    clcf->loc_conf = ctx->loc_conf;
    clcf->name = pclcf->name;
    clcf->noname = 1;

    if (ngx_http_add_location(cf, &pclcf->locations, clcf) != NGX_OK) {
        return NGX_CONF_ERROR;
    }

    if (ngx_http_rewrite_if_condition(cf, lcf) != NGX_CONF_OK) {
        return NGX_CONF_ERROR;
    }

    if_code = ngx_array_push_n(lcf->codes, sizeof(ngx_http_script_if_code_t));
    if (if_code == NULL) {
        return NGX_CONF_ERROR;
    }

    if_code->code = ngx_http_script_if_code;

    elts = lcf->codes->elts;


    /* the inner directives must be compiled to the same code array */

    nlcf = ctx->loc_conf[ngx_http_rewrite_module.ctx_index];
    nlcf->codes = lcf->codes;


    save = *cf;
    cf->ctx = ctx;

    if (cf->cmd_type == NGX_HTTP_SRV_CONF) {
        if_code->loc_conf = NULL;
        cf->cmd_type = NGX_HTTP_SIF_CONF;

    } else {
        if_code->loc_conf = ctx->loc_conf;
        cf->cmd_type = NGX_HTTP_LIF_CONF;
    }

    rv = ngx_conf_parse(cf, NULL);

    *cf = save;

    if (rv != NGX_CONF_OK) {
        return rv;
    }


    if (elts != lcf->codes->elts) {
        if_code = (ngx_http_script_if_code_t *)
                   ((u_char *) if_code + ((u_char *) lcf->codes->elts - elts));
    }

    if_code->next = (u_char *) lcf->codes->elts + lcf->codes->nelts
                                                - (u_char *) if_code;

    /* the code array belong to parent block */

    nlcf->codes = NULL;

    return NGX_CONF_OK;
}